

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar2;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar3;
  LogMessage *pLVar4;
  CppType *pCVar5;
  CppType *pCVar6;
  MessageLite *pMVar7;
  LogMessage local_b8;
  Voidify local_a1;
  CppType local_a0;
  CppType local_9c;
  Nullable<const_char_*> local_98;
  LogMessage local_90;
  Voidify local_79;
  anon_enum_32 local_78;
  anon_enum_32 local_74;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  CppType local_40;
  CppType local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  MessageLite *prototype_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)prototype;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,(Extension **)&absl_log_internal_check_op_result)
  ;
  if (bVar1) {
    absl_log_internal_check_op_result[8] = prototype_local._3_1_;
    local_3c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_3c);
    local_40 = CPPTYPE_MESSAGE;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x351,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    absl_log_internal_check_op_result[9] = '\x01';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
    pRVar2 = Arena::Create<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                       (this->arena_);
    *(RepeatedPtrField<google::protobuf::MessageLite> **)absl_log_internal_check_op_result = pRVar2;
  }
  else {
    local_74 = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_74);
    local_78 = REPEATED_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_78);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x357,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    local_9c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_9c);
    local_a0 = CPPTYPE_MESSAGE;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a0);
    local_98 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_98 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x357,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_b8);
    }
    local_98 = (Nullable<const_char_*>)0x0;
  }
  pMVar7 = RepeatedPtrFieldBase::AddMessage
                     (*(RepeatedPtrFieldBase **)absl_log_internal_check_op_result,
                      (MessageLite *)descriptor_local);
  return pMVar7;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}